

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

u_int slength(slist *s)

{
  u_int n;
  
  n = 0;
  for (; s != (slist *)0x0; s = s->next) {
    n = n + ((s->s).code != -1);
  }
  return n;
}

Assistant:

static u_int
slength(struct slist *s)
{
	u_int n = 0;

	for (; s; s = s->next)
		if (s->s.code != NOP)
			++n;
	return n;
}